

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O2

void duckdb_brotli::BrotliConvertBitDepthsToSymbols(uint8_t *depth,size_t len,uint16_t *bits)

{
  short *psVar1;
  byte bVar2;
  ushort uVar3;
  size_t sVar4;
  long lVar5;
  uint16_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  short sStack_5a;
  ulong local_58;
  undefined8 uStack_50;
  uint16_t bl_count [16];
  
  bl_count[0] = 0;
  bl_count[1] = 0;
  bl_count[2] = 0;
  bl_count[3] = 0;
  bl_count[4] = 0;
  bl_count[5] = 0;
  bl_count[6] = 0;
  bl_count[7] = 0;
  local_58 = 0;
  uStack_50 = 0;
  for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
    psVar1 = (short *)((long)&local_58 + (ulong)depth[sVar4] * 2);
    *psVar1 = *psVar1 + 1;
  }
  local_58 = local_58 & 0xffffffffffff0000;
  uVar6 = 0;
  for (lVar5 = 1; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    uVar6 = (uVar6 + (&sStack_5a)[lVar5]) * 2;
    bl_count[lVar5 + 8] = uVar6;
  }
  for (sVar4 = 0; sVar4 != len; sVar4 = sVar4 + 1) {
    bVar2 = depth[sVar4];
    uVar7 = (ulong)bVar2;
    if (uVar7 != 0) {
      uVar3 = bl_count[uVar7 + 8];
      uVar9 = (uint)uVar3;
      bl_count[uVar7 + 8] = uVar3 + 1;
      uVar10 = *(ulong *)(BrotliReverseBits(unsigned_long,unsigned_short)::kLut +
                         (ulong)(uVar3 & 0xf) * 8);
      for (uVar8 = 4; uVar8 < uVar7; uVar8 = uVar8 + 4) {
        uVar9 = uVar9 >> 4;
        uVar10 = uVar10 << 4 |
                 *(ulong *)(BrotliReverseBits(unsigned_long,unsigned_short)::kLut +
                           (ulong)(uVar9 & 0xf) * 8);
      }
      bits[sVar4] = (uint16_t)(uVar10 >> (-bVar2 & 3));
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliConvertBitDepthsToSymbols(const uint8_t* depth,
                                     size_t len,
                                     uint16_t* bits) {
  /* In Brotli, all bit depths are [1..15]
     0 bit depth means that the symbol does not exist. */
  uint16_t bl_count[MAX_HUFFMAN_BITS] = { 0 };
  uint16_t next_code[MAX_HUFFMAN_BITS];
  size_t i;
  int code = 0;
  for (i = 0; i < len; ++i) {
    ++bl_count[depth[i]];
  }
  bl_count[0] = 0;
  next_code[0] = 0;
  for (i = 1; i < MAX_HUFFMAN_BITS; ++i) {
    code = (code + bl_count[i - 1]) << 1;
    next_code[i] = (uint16_t)code;
  }
  for (i = 0; i < len; ++i) {
    if (depth[i]) {
      bits[i] = BrotliReverseBits(depth[i], next_code[depth[i]]++);
    }
  }
}